

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O0

void __thiscall PathTest::NormalizeTest(PathTest *this)

{
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 local_38 [8];
  Path p;
  int i;
  PathTest *this_local;
  
  for (p.mPath.field_2._12_4_ = 0; (int)p.mPath.field_2._12_4_ < 0xb;
      p.mPath.field_2._12_4_ = p.mPath.field_2._12_4_ + 1) {
    JetHead::Path::Path((Path *)local_38,normalizeTestData[(int)p.mPath.field_2._12_4_].path);
    JetHead::Path::normalize();
    bVar2 = JetHead::Path::operator!=
                      ((Path *)local_38,normalizeTestData[(int)p.mPath.field_2._12_4_].norm_path);
    if (bVar2) {
      pcVar1 = normalizeTestData[(int)p.mPath.field_2._12_4_].path;
      JetHead::Path::getString_abi_cxx11_((Path *)local_38);
      uVar3 = std::__cxx11::string::c_str();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xce,"Normalize of %s failed (%s)",pcVar1,uVar3);
    }
    JetHead::Path::~Path((Path *)local_38);
  }
  return;
}

Assistant:

void PathTest::NormalizeTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( normalizeTestData ); i++ )
	{
		Path p = normalizeTestData[ i ].path;
		p.normalize();
		if ( p != normalizeTestData[ i ].norm_path )
			TestFailed( "Normalize of %s failed (%s)", normalizeTestData[ i ].path, p.getString().c_str() );
	}
}